

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O0

void __thiscall
spirv_cross::CompilerGLSL::emit_buffer_reference_block
          (CompilerGLSL *this,uint32_t type_id,bool forward_declaration)

{
  __node_base_ptr *t;
  uint uVar1;
  byte bVar2;
  bool bVar3;
  uint32_t uVar4;
  SPIRType *type_00;
  ulong uVar5;
  mapped_type *this_00;
  pointer ppVar6;
  pair<std::__detail::_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>,_bool>
  pVar7;
  bool local_401;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3c0 [32];
  SPIRType *local_3a0;
  SPIRType *pointee_type;
  string local_390 [32];
  TypedID *local_370;
  TypedID<(spirv_cross::Types)1> *member;
  TypedID<(spirv_cross::Types)1> *__end3;
  TypedID<(spirv_cross::Types)1> *__begin3;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)1>,_8UL> *__range3;
  spirv_cross local_348 [4];
  uint32_t i;
  string local_328 [8];
  string decorations;
  undefined1 local_308 [8];
  Bitset flags;
  spirv_cross local_2a8 [39];
  allocator local_281;
  string local_280 [32];
  undefined1 local_260 [8];
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  attributes;
  uint local_13c;
  _Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
  _Stack_138;
  uint32_t alignment;
  iterator itr;
  string local_110 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_f0;
  undefined1 local_e8;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_e0;
  undefined1 local_d8;
  spirv_cross local_d0 [32];
  spirv_cross local_b0 [32];
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_90;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_88;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_80;
  _Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  local_78 [3];
  string local_60 [32];
  string local_40 [8];
  string buffer_name;
  SPIRType *type;
  bool forward_declaration_local;
  CompilerGLSL *pCStack_10;
  uint32_t type_id_local;
  CompilerGLSL *this_local;
  
  type._3_1_ = forward_declaration;
  type._4_4_ = type_id;
  pCStack_10 = this;
  type_00 = Compiler::get<spirv_cross::SPIRType>(&this->super_Compiler,type_id);
  ::std::__cxx11::string::string(local_40);
  if ((type._3_1_ & 1) == 0) {
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
      (*(this->super_Compiler)._vptr_Compiler[6])(&itr,this,(ulong)uVar4,0);
      ::std::__cxx11::string::operator=(local_40,(string *)&itr);
      ::std::__cxx11::string::~string((string *)&itr);
    }
    else {
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_110,this,type_00,0);
      ::std::__cxx11::string::operator=(local_40,local_110);
      ::std::__cxx11::string::~string(local_110);
    }
  }
  else {
    uVar4 = TypedID::operator_cast_to_unsigned_int((TypedID *)&(type_00->super_IVariant).self);
    (*(this->super_Compiler)._vptr_Compiler[6])(local_60,this,(ulong)uVar4,0);
    ::std::__cxx11::string::operator=(local_40,local_60);
    ::std::__cxx11::string::~string(local_60);
    ::std::
    unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
    ::operator[](&(this->super_Compiler).ir.meta,&(type_00->super_IVariant).self);
    bVar2 = ::std::__cxx11::string::empty();
    local_401 = true;
    if ((bVar2 & 1) == 0) {
      local_78[0]._M_cur =
           (__node_type *)
           ::std::
           unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find(&this->block_ssbo_names,(key_type *)local_40);
      local_80._M_cur =
           (__node_type *)
           ::std::
           end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                     (&this->block_ssbo_names);
      bVar3 = ::std::__detail::operator!=(local_78,&local_80);
      local_401 = true;
      if (!bVar3) {
        local_88._M_cur =
             (__node_type *)
             ::std::
             unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::find(&this->resource_names,(key_type *)local_40);
        local_90._M_cur =
             (__node_type *)
             ::std::
             end<std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                       (&this->resource_names);
        local_401 = ::std::__detail::operator!=(&local_88,&local_90);
      }
    }
    if (local_401 != false) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                (local_b0,(char (*) [2])0x5eeb74,&(type_00->super_IVariant).self);
      ::std::__cxx11::string::operator=(local_40,(string *)local_b0);
      ::std::__cxx11::string::~string((string *)local_b0);
    }
    add_variable(this,&this->block_ssbo_names,&this->resource_names,(string *)local_40);
    uVar5 = ::std::__cxx11::string::empty();
    if ((uVar5 & 1) != 0) {
      join<char_const(&)[2],spirv_cross::TypedID<(spirv_cross::Types)0>&>
                (local_d0,(char (*) [2])0x5eeb74,&(type_00->super_IVariant).self);
      ::std::__cxx11::string::operator=(local_40,(string *)local_d0);
      ::std::__cxx11::string::~string((string *)local_d0);
    }
    pVar7 = ::std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->block_names,(value_type *)local_40);
    local_e0._M_cur =
         (__node_type *)
         pVar7.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_d8 = pVar7.second;
    pVar7 = ::std::
            unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::insert(&this->block_ssbo_names,(value_type *)local_40);
    local_f0._M_cur =
         (__node_type *)
         pVar7.first.
         super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
         ._M_cur;
    local_e8 = pVar7.second;
    this_00 = ::std::
              unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
              ::operator[](&(this->super_Compiler).ir.meta,&(type_00->super_IVariant).self);
    ::std::__cxx11::string::operator=((string *)this_00,local_40);
  }
  if ((type._3_1_ & 1) == 0) {
    _Stack_138._M_cur =
         (__node_type *)
         ::std::
         unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>_>
         ::find(&(this->super_Compiler).physical_storage_type_to_alignment,
                (key_type *)((long)&type + 4));
    local_13c = 0;
    attributes.stack_storage.aligned_char._248_8_ =
         ::std::
         unordered_map<unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>_>_>
         ::end(&(this->super_Compiler).physical_storage_type_to_alignment);
    bVar3 = ::std::__detail::operator!=
                      (&stack0xfffffffffffffec8,
                       (_Node_iterator_base<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false>
                        *)(attributes.stack_storage.aligned_char + 0xf8));
    if (bVar3) {
      ppVar6 = ::std::__detail::
               _Node_iterator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false,_false>
               ::operator->((_Node_iterator<std::pair<const_unsigned_int,_spirv_cross::Compiler::PhysicalBlockMeta>,_false,_false>
                             *)&stack0xfffffffffffffec8);
      local_13c = (ppVar6->second).alignment;
    }
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_260);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string(local_280,"buffer_reference",&local_281);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_260,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_280);
      ::std::__cxx11::string::~string(local_280);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_281);
      if (local_13c != 0) {
        join<char_const(&)[26],unsigned_int&>(local_2a8,(char (*) [26])0x5e2f35,&local_13c);
        SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
        ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                     *)local_260,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2a8);
        ::std::__cxx11::string::~string((string *)local_2a8);
      }
      buffer_to_packing_standard_abi_cxx11_
                ((CompilerGLSL *)&flags.higher._M_h._M_single_bucket,(SPIRType *)this,
                 SUB81(type_00,0));
      t = &flags.higher._M_h._M_single_bucket;
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::push_back((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                   *)local_260,
                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)t);
      ::std::__cxx11::string::~string((string *)t);
      ParsedIR::get_buffer_block_type_flags((Bitset *)local_308,&(this->super_Compiler).ir,type_00);
      ::std::__cxx11::string::string(local_328);
      bVar3 = Bitset::get((Bitset *)local_308,0x13);
      if (bVar3) {
        ::std::__cxx11::string::operator+=(local_328," restrict");
      }
      bVar3 = Bitset::get((Bitset *)local_308,0x17);
      if (bVar3) {
        ::std::__cxx11::string::operator+=(local_328," coherent");
      }
      bVar3 = Bitset::get((Bitset *)local_308,0x19);
      if (bVar3) {
        ::std::__cxx11::string::operator+=(local_328," writeonly");
      }
      bVar3 = Bitset::get((Bitset *)local_308,0x18);
      if (bVar3) {
        ::std::__cxx11::string::operator+=(local_328," readonly");
      }
      merge(local_348,
            (SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
             *)local_260,", ");
      statement<char_const(&)[8],std::__cxx11::string,char_const(&)[2],std::__cxx11::string&,char_const(&)[9],std::__cxx11::string&>
                (this,(char (*) [8])"layout(",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_348,
                 (char (*) [2])0x5eaa1a,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_328,
                 (char (*) [9])0x5e2f67,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      ::std::__cxx11::string::~string((string *)local_348);
      ::std::__cxx11::string::~string(local_328);
      Bitset::~Bitset((Bitset *)local_308);
      SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
      ::~SmallVector((SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
                      *)local_260);
    }
    else if (local_13c == 0) {
      statement<char_const(&)[33],std::__cxx11::string&>
                (this,(char (*) [33])"layout(buffer_reference) buffer ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    else {
      statement<char_const(&)[51],unsigned_int&,char_const(&)[10],std::__cxx11::string&>
                (this,(char (*) [51])"layout(buffer_reference, buffer_reference_align = ",&local_13c
                 ,(char (*) [10])0x5e2f66,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
    }
    begin_scope(this);
    if (*(int *)&(type_00->super_IVariant).field_0xc == 0xf) {
      ::std::
      unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&type_00->member_name_cache);
      __range3._4_4_ = 0;
      __begin3 = (TypedID<(spirv_cross::Types)1> *)&type_00->member_types;
      __end3 = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::begin
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
      member = VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_>::end
                         ((VectorView<spirv_cross::TypedID<(spirv_cross::Types)1>_> *)__begin3);
      for (; __end3 != member; __end3 = __end3 + 1) {
        local_370 = (TypedID *)__end3;
        add_member_name(this,type_00,__range3._4_4_);
        uVar4 = TypedID::operator_cast_to_unsigned_int(local_370);
        uVar1 = __range3._4_4_;
        ::std::allocator<char>::allocator();
        ::std::__cxx11::string::string(local_390,"",(allocator *)((long)&pointee_type + 7));
        (*(this->super_Compiler)._vptr_Compiler[0x15])
                  (this,type_00,(ulong)uVar4,(ulong)uVar1,local_390,0);
        ::std::__cxx11::string::~string(local_390);
        ::std::allocator<char>::~allocator((allocator<char> *)((long)&pointee_type + 7));
        __range3._4_4_ = __range3._4_4_ + 1;
      }
    }
    else {
      local_3a0 = Compiler::get_pointee_type(&this->super_Compiler,type_00);
      (*(this->super_Compiler)._vptr_Compiler[0x13])(local_3c0,this,local_3a0,0);
      (*(this->super_Compiler)._vptr_Compiler[0x26])(local_3e0,this,local_3a0);
      statement<std::__cxx11::string,char_const(&)[7],std::__cxx11::string,char_const(&)[2]>
                (this,local_3c0,(char (*) [7])" value",local_3e0,(char (*) [2])0x5e9b70);
      ::std::__cxx11::string::~string((string *)local_3e0);
      ::std::__cxx11::string::~string((string *)local_3c0);
    }
    end_scope_decl(this);
    statement<char_const(&)[1]>(this,(char (*) [1])0x5df766);
  }
  else {
    statement<char_const(&)[33],std::__cxx11::string&,char_const(&)[2]>
              (this,(char (*) [33])"layout(buffer_reference) buffer ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               (char (*) [2])0x5e9b70);
  }
  ::std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

void CompilerGLSL::emit_buffer_reference_block(uint32_t type_id, bool forward_declaration)
{
	auto &type = get<SPIRType>(type_id);
	string buffer_name;

	if (forward_declaration)
	{
		// Block names should never alias, but from HLSL input they kind of can because block types are reused for UAVs ...
		// Allow aliased name since we might be declaring the block twice. Once with buffer reference (forward declared) and one proper declaration.
		// The names must match up.
		buffer_name = to_name(type.self, false);

		// Shaders never use the block by interface name, so we don't
		// have to track this other than updating name caches.
		// If we have a collision for any reason, just fallback immediately.
		if (ir.meta[type.self].decoration.alias.empty() ||
		    block_ssbo_names.find(buffer_name) != end(block_ssbo_names) ||
		    resource_names.find(buffer_name) != end(resource_names))
		{
			buffer_name = join("_", type.self);
		}

		// Make sure we get something unique for both global name scope and block name scope.
		// See GLSL 4.5 spec: section 4.3.9 for details.
		add_variable(block_ssbo_names, resource_names, buffer_name);

		// If for some reason buffer_name is an illegal name, make a final fallback to a workaround name.
		// This cannot conflict with anything else, so we're safe now.
		// We cannot reuse this fallback name in neither global scope (blocked by block_names) nor block name scope.
		if (buffer_name.empty())
			buffer_name = join("_", type.self);

		block_names.insert(buffer_name);
		block_ssbo_names.insert(buffer_name);

		// Ensure we emit the correct name when emitting non-forward pointer type.
		ir.meta[type.self].decoration.alias = buffer_name;
	}
	else if (type.basetype != SPIRType::Struct)
		buffer_name = type_to_glsl(type);
	else
		buffer_name = to_name(type.self, false);

	if (!forward_declaration)
	{
		auto itr = physical_storage_type_to_alignment.find(type_id);
		uint32_t alignment = 0;
		if (itr != physical_storage_type_to_alignment.end())
			alignment = itr->second.alignment;

		if (type.basetype == SPIRType::Struct)
		{
			SmallVector<std::string> attributes;
			attributes.push_back("buffer_reference");
			if (alignment)
				attributes.push_back(join("buffer_reference_align = ", alignment));
			attributes.push_back(buffer_to_packing_standard(type, true));

			auto flags = ir.get_buffer_block_type_flags(type);
			string decorations;
			if (flags.get(DecorationRestrict))
				decorations += " restrict";
			if (flags.get(DecorationCoherent))
				decorations += " coherent";
			if (flags.get(DecorationNonReadable))
				decorations += " writeonly";
			if (flags.get(DecorationNonWritable))
				decorations += " readonly";

			statement("layout(", merge(attributes), ")", decorations, " buffer ", buffer_name);
		}
		else if (alignment)
			statement("layout(buffer_reference, buffer_reference_align = ", alignment, ") buffer ", buffer_name);
		else
			statement("layout(buffer_reference) buffer ", buffer_name);

		begin_scope();

		if (type.basetype == SPIRType::Struct)
		{
			type.member_name_cache.clear();

			uint32_t i = 0;
			for (auto &member : type.member_types)
			{
				add_member_name(type, i);
				emit_struct_member(type, member, i);
				i++;
			}
		}
		else
		{
			auto &pointee_type = get_pointee_type(type);
			statement(type_to_glsl(pointee_type), " value", type_to_array_glsl(pointee_type), ";");
		}

		end_scope_decl();
		statement("");
	}
	else
	{
		statement("layout(buffer_reference) buffer ", buffer_name, ";");
	}
}